

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O2

Fraction operator*(Fraction *a,Fraction *b)

{
  Fraction FVar1;
  Fraction local_10;
  
  local_10.numerator_ = b->numerator_ * (*a).numerator_;
  local_10.denominator_ = (*a).denominator_ * b->denominator_;
  Fraction::Normalization(&local_10);
  FVar1.denominator_ = local_10.denominator_;
  FVar1.numerator_ = local_10.numerator_;
  return FVar1;
}

Assistant:

Fraction operator*(const Fraction& a, const Fraction& b) {
  Fraction current_frac = a;
  current_frac.numerator_ *= b.numerator_;
  current_frac.denominator_ *= b.denominator_;
  current_frac.Normalization();
  return current_frac;
}